

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O2

StatusOr<unsigned_long> __thiscall
google::protobuf::json_internal::JsonLexer::ParseUnicodeEscape(JsonLexer *this,char *out_utf8)

{
  bool bVar1;
  byte *in_RDX;
  anon_union_8_2_a3c22f61_for_StatusOrData<unsigned_long>_3 extraout_RDX;
  byte bVar2;
  uint uVar3;
  StatusOr<unsigned_long> SVar4;
  Status _status;
  anon_union_2_2_a3c22f61_for_StatusOrData<unsigned_short>_3 local_48;
  Status _status_2;
  StatusOr<unsigned_short> hex;
  
  ParseU16HexCodepoint((JsonLexer *)&hex);
  absl::lts_20240722::Status::Status(&_status,(Status *)&hex);
  if (_status.rep_ == 1) {
    absl::lts_20240722::Status::~Status(&_status);
    absl::lts_20240722::internal_statusor::StatusOrData<unsigned_short>::EnsureOk
              (&hex.super_StatusOrData<unsigned_short>);
    uVar3 = (uint)hex.super_StatusOrData<unsigned_short>.field_1.data_;
    if ((uVar3 & 0xfc00) != 0xdc00) {
      if ((uVar3 & 0xfc00) == 0xd800) {
        Expect((JsonLexer *)&_status,out_utf8,2,"\\u");
        if (_status.rep_ != 1) {
          absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::
          StatusOrData<const_absl::lts_20240722::Status,_0>
                    ((StatusOrData<unsigned_long> *)this,&_status);
          goto LAB_0028b409;
        }
        absl::lts_20240722::Status::~Status(&_status);
        ParseU16HexCodepoint((JsonLexer *)&_status);
        absl::lts_20240722::Status::Status(&_status_2,&_status);
        if (_status_2.rep_ == 1) {
          absl::lts_20240722::Status::~Status(&_status_2);
          absl::lts_20240722::internal_statusor::StatusOrData<unsigned_short>::EnsureOk
                    ((StatusOrData<unsigned_short> *)&_status);
          if ((local_48.data_ & 0xfc00) != 0xdc00) {
            JsonLocation::Invalid
                      ((JsonLocation *)&_status_2,out_utf8 + 0x60,0x15,"invalid low surrogate");
            absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::
            StatusOrData<absl::lts_20240722::Status,_0>
                      ((StatusOrData<unsigned_long> *)this,&_status_2);
            goto LAB_0028b440;
          }
          uVar3 = (hex.super_StatusOrData<unsigned_short>.field_1.data_ & 0x3ff) * 0x400 +
                  (local_48.data_ & 0x3ff) + 0x10000;
          bVar1 = true;
        }
        else {
          absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::
          StatusOrData<const_absl::lts_20240722::Status,_0>
                    ((StatusOrData<unsigned_long> *)this,&_status_2);
LAB_0028b440:
          absl::lts_20240722::Status::~Status(&_status_2);
          bVar1 = false;
        }
        absl::lts_20240722::Status::~Status(&_status);
        if (!bVar1) goto LAB_0028b515;
      }
      bVar2 = (byte)uVar3;
      if (uVar3 < 0x80) {
        *in_RDX = bVar2;
        (this->stream_).last_chunk_._M_len = 1;
        (this->stream_).stream_ = (ZeroCopyInputStream *)0x1;
      }
      else {
        if (uVar3 < 0x800) {
          *in_RDX = (byte)(uVar3 >> 6) | 0xc0;
          in_RDX[1] = bVar2 & 0x3f | 0x80;
          (this->stream_).last_chunk_._M_len = 2;
        }
        else if (uVar3 < 0x10000) {
          *in_RDX = (byte)(uVar3 >> 0xc) | 0xe0;
          in_RDX[1] = (byte)(uVar3 >> 6) & 0x3f | 0x80;
          in_RDX[2] = bVar2 & 0x3f | 0x80;
          (this->stream_).last_chunk_._M_len = 3;
        }
        else {
          *in_RDX = (byte)(uVar3 >> 0x12) | 0xf0;
          in_RDX[1] = (byte)(uVar3 >> 0xc) & 0x3f | 0x80;
          in_RDX[2] = (byte)(uVar3 >> 6) & 0x3f | 0x80;
          in_RDX[3] = bVar2 & 0x3f | 0x80;
          (this->stream_).last_chunk_._M_len = 4;
        }
        (this->stream_).stream_ = (ZeroCopyInputStream *)0x1;
      }
      goto LAB_0028b515;
    }
    JsonLocation::Invalid((JsonLocation *)&_status,out_utf8 + 0x60,0x16,"unpaired low surrogate");
    absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::
    StatusOrData<absl::lts_20240722::Status,_0>((StatusOrData<unsigned_long> *)this,&_status);
  }
  else {
    absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::
    StatusOrData<const_absl::lts_20240722::Status,_0>((StatusOrData<unsigned_long> *)this,&_status);
  }
LAB_0028b409:
  absl::lts_20240722::Status::~Status(&_status);
LAB_0028b515:
  absl::lts_20240722::Status::~Status((Status *)&hex);
  SVar4.super_StatusOrData<unsigned_long>.field_1.data_ = extraout_RDX.data_;
  SVar4.super_StatusOrData<unsigned_long>.field_0 =
       (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)this;
  return (StatusOr<unsigned_long>)SVar4.super_StatusOrData<unsigned_long>;
}

Assistant:

absl::StatusOr<size_t> JsonLexer::ParseUnicodeEscape(char out_utf8[4]) {
  auto hex = ParseU16HexCodepoint();
  RETURN_IF_ERROR(hex.status());

  uint32_t rune = *hex;
  if (rune >= 0xd800 && rune <= 0xdbff) {
    // Surrogate pair: two 16-bit codepoints become a 32-bit codepoint.
    uint32_t high = rune;

    RETURN_IF_ERROR(Expect("\\u"));
    auto hex = ParseU16HexCodepoint();
    RETURN_IF_ERROR(hex.status());

    uint32_t low = *hex;
    if (low < 0xdc00 || low > 0xdfff) {
      return Invalid("invalid low surrogate");
    }

    rune = (high & 0x3ff) << 10;
    rune |= (low & 0x3ff);
    rune += 0x10000;
  } else if (rune >= 0xdc00 && rune <= 0xdfff) {
    return Invalid("unpaired low surrogate");
  }

  // Write as UTF-8.
  if (rune <= 0x7f) {
    out_utf8[0] = rune;
    return 1;
  } else if (rune <= 0x07ff) {
    out_utf8[0] = ((rune >> 6) & 0x1f) | 0xc0;
    out_utf8[1] = ((rune >> 0) & 0x3f) | 0x80;
    return 2;
  } else if (rune <= 0xffff) {
    out_utf8[0] = ((rune >> 12) & 0x0f) | 0xe0;
    out_utf8[1] = ((rune >> 6) & 0x3f) | 0x80;
    out_utf8[2] = ((rune >> 0) & 0x3f) | 0x80;
    return 3;
  } else if (rune <= 0x10ffff) {
    out_utf8[0] = ((rune >> 18) & 0x07) | 0xF0;
    out_utf8[1] = ((rune >> 12) & 0x3f) | 0x80;
    out_utf8[2] = ((rune >> 6) & 0x3f) | 0x80;
    out_utf8[3] = ((rune >> 0) & 0x3f) | 0x80;
    return 4;
  } else {
    return Invalid("invalid codepoint");
  }
}